

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pMVar3;
  pointer pcVar4;
  undefined8 uVar5;
  int iVar6;
  OfType OVar7;
  undefined8 in_RCX;
  XmlFormatting fmt;
  pointer pMVar8;
  char cVar9;
  string local_b8;
  XmlReporter *local_98;
  undefined4 local_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  string local_68;
  undefined1 local_48 [16];
  ostream *poStack_38;
  
  local_98 = this;
  iVar6 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_8c = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (((char)iVar6 == '\0') &&
     ((OVar7 = (assertionStats->assertionResult).m_resultData.resultType, (OVar7 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar7 != Warning) {
      return true;
    }
    local_8c = 0;
  }
  pMVar8 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fmt = (XmlFormatting)&local_b8;
  local_48._0_8_ = assertionStats;
  if (pMVar8 != pMVar3) {
    pXVar1 = &local_98->m_xml;
    cVar9 = (char)local_8c;
    do {
      if (pMVar8->type == Info && cVar9 == '\x01') {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
        XmlWriter::scopedElement((XmlWriter *)local_88,(string *)pXVar1,fmt);
        XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar8->message,Newline|Indent);
LAB_00130222:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      else if (pMVar8->type == Warning) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Warning","");
        XmlWriter::scopedElement((XmlWriter *)local_88,(string *)pXVar1,fmt);
        XmlWriter::writeText((XmlWriter *)local_88._0_8_,&pMVar8->message,Newline|Indent);
        goto LAB_00130222;
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar3);
  }
  uVar5 = local_48._0_8_;
  OVar7 = *(OfType *)(local_48._0_8_ + 0x90);
  if ((byte)((byte)local_8c | OVar7 == Warning) == 1) {
    if (*(size_type *)(local_48._0_8_ + 0x30) != 0) {
      paVar2 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expression","");
      pXVar1 = &local_98->m_xml;
      XmlWriter::startElement(pXVar1,&local_b8,Newline|Indent);
      local_88._0_8_ = (XmlWriter *)local_78;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"success","");
      XmlWriter::writeAttribute
                (pXVar1,(string *)local_88,(*(undefined1 *)(uVar5 + 0x90) & FailureBit) == Ok);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"type","");
      local_48._8_8_ = (((AssertionResult *)(uVar5 + 8))->m_info).macroName.m_start;
      poStack_38 = *(ostream **)(uVar5 + 0x10);
      XmlWriter::writeAttribute<Catch::StringRef>
                (pXVar1,(string *)(local_78 + 0x10),(StringRef *)(local_48 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = ((SourceLineInfo *)(uVar5 + 0x18))->file;
      local_b8._M_string_length = *(size_t *)(uVar5 + 0x20);
      writeSourceInfo(local_98,(SourceLineInfo *)&local_b8);
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Original","");
      XmlWriter::scopedElement((XmlWriter *)(local_78 + 0x10),(string *)pXVar1,fmt);
      AssertionResult::getExpression_abi_cxx11_((string *)local_88,(AssertionResult *)(uVar5 + 8));
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expanded","");
      XmlWriter::scopedElement((XmlWriter *)(local_78 + 0x10),(string *)pXVar1,fmt);
      AssertionResult::getExpandedExpression_abi_cxx11_
                ((string *)local_88,(AssertionResult *)(uVar5 + 8));
      XmlWriter::writeText((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent)
      ;
      if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
        operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      OVar7 = *(OfType *)(uVar5 + 0x90);
    }
    if (OVar7 < ExplicitFailure) {
      if (OVar7 == Info) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
        XmlWriter::scopedElement((XmlWriter *)(local_78 + 0x10),(string *)&local_98->m_xml,fmt);
        pcVar4 = (((AssertionResultData *)(uVar5 + 0x40))->message)._M_dataplus._M_p;
        local_88._0_8_ = (XmlWriter *)local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,pcVar4,pcVar4 + *(size_type *)(uVar5 + 0x48));
        XmlWriter::writeText
                  ((XmlWriter *)local_68._M_dataplus._M_p,(string *)local_88,Newline|Indent);
        if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
        }
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else if (OVar7 == ExplicitFailure) {
      paVar2 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Failure","");
      pXVar1 = &local_98->m_xml;
      XmlWriter::startElement(pXVar1,&local_b8,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = ((SourceLineInfo *)(uVar5 + 0x18))->file;
      local_b8._M_string_length = *(size_t *)(uVar5 + 0x20);
      writeSourceInfo(local_98,(SourceLineInfo *)&local_b8);
      pcVar4 = (((AssertionResultData *)(uVar5 + 0x40))->message)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar4,pcVar4 + *(size_type *)(uVar5 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b8,Newline|Indent);
      assertionEnded();
    }
    else if (OVar7 == FatalErrorCondition) {
      paVar2 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FatalErrorCondition","");
      pXVar1 = &local_98->m_xml;
      XmlWriter::startElement(pXVar1,&local_b8,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = ((SourceLineInfo *)(uVar5 + 0x18))->file;
      local_b8._M_string_length = *(size_t *)(uVar5 + 0x20);
      writeSourceInfo(local_98,(SourceLineInfo *)&local_b8);
      pcVar4 = (((AssertionResultData *)(uVar5 + 0x40))->message)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar4,pcVar4 + *(size_type *)(uVar5 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b8,Newline|Indent);
      assertionEnded();
    }
    else if (OVar7 == ThrewException) {
      paVar2 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Exception","");
      pXVar1 = &local_98->m_xml;
      XmlWriter::startElement(pXVar1,&local_b8,Newline|Indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = ((SourceLineInfo *)(uVar5 + 0x18))->file;
      local_b8._M_string_length = *(size_t *)(uVar5 + 0x20);
      writeSourceInfo(local_98,(SourceLineInfo *)&local_b8);
      pcVar4 = (((AssertionResultData *)(uVar5 + 0x40))->message)._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar4,pcVar4 + *(size_type *)(uVar5 + 0x48));
      XmlWriter::writeText(pXVar1,&local_b8,Newline|Indent);
      assertionEnded();
    }
    if (*(size_type *)(uVar5 + 0x30) != 0) {
      XmlWriter::endElement(&local_98->m_xml,Newline|Indent);
    }
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }